

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::SetNotNull(DuckTableEntry *this,ClientContext *context,SetNotNullInfo *info)

{
  idx_t *this_00;
  Catalog *pCVar1;
  SchemaCatalogEntry *pSVar2;
  bool bVar3;
  pointer pCVar4;
  ColumnDefinition *this_01;
  reference this_02;
  pointer pCVar5;
  NotNullConstraint *pNVar6;
  Binder *info_00;
  type pBVar7;
  type args_2;
  BinderException *this_03;
  long in_RCX;
  ulong __n;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_100;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  element_type *local_e8;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  LogicalIndex not_null_idx;
  undefined1 local_b0 [8];
  shared_ptr<duckdb::Binder,_true> binder;
  PhysicalIndex physical_columns;
  
  make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
            ((duckdb *)&local_100,
             *(SchemaCatalogEntry **)&(context->config).query_verification_enabled,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &context->interrupted);
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  Value::operator=(&(pCVar4->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar4->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(context->config).profiler_settings._M_h._M_before_begin);
  this_00 = &(context->config).asof_loop_join_threshold;
  ColumnList::Copy((ColumnList *)&binder,(ColumnList *)this_00);
  pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_100);
  ColumnList::operator=(&pCVar4->columns,(ColumnList *)&binder);
  ColumnList::~ColumnList((ColumnList *)&binder);
  not_null_idx = TableCatalogEntry::GetColumnIndex
                           ((TableCatalogEntry *)context,(string *)(in_RCX + 0x78),false);
  this_01 = ColumnList::GetColumn((ColumnList *)this_00,not_null_idx);
  bVar3 = ColumnDefinition::Generated(this_01);
  if (!bVar3) {
    bVar3 = false;
    for (__n = 0; __n < (ulong)((long)((long)(context->config).set_variables._M_h._M_single_bucket -
                                      (context->config).set_variables._M_h._M_rehash_policy.
                                      _M_next_resize) >> 3); __n = __n + 1) {
      this_02 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                             *)&(context->config).set_variables._M_h._M_rehash_policy._M_next_resize
                            ,__n);
      pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_02);
      (*pCVar5->_vptr_Constraint[3])(&binder,pCVar5);
      pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)&binder);
      if (pCVar5->type == NOT_NULL) {
        pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                             *)&binder);
        pNVar6 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar5);
        bVar3 = (bool)(bVar3 | (pNVar6->index).index == not_null_idx.index);
      }
      pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_100);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar4->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 &binder);
      if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*(code *)((((binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
    }
    if (!bVar3) {
      pCVar4 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_100);
      make_uniq<duckdb::NotNullConstraint,duckdb::LogicalIndex&>
                ((duckdb *)&new_storage,&not_null_idx);
      binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           new_storage.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      new_storage.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar4->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 &binder);
      if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*(code *)((((binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (new_storage.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        (*(code *)((((new_storage.internal.
                      super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
                    super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
                  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ();
      }
    }
    Binder::CreateBinder
              ((Binder *)&binder,(ClientContext *)info,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
    info_00 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
    local_e8 = (element_type *)local_100._M_head_impl;
    local_100._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)&bound_create_info,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               info_00,(SchemaCatalogEntry *)&local_e8);
    if (local_e8 != (element_type *)0x0) {
      (*(((CreateInfo *)&local_e8->super_enable_shared_from_this<duckdb::DatabaseInstance>)->
        super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_e8 = (element_type *)0x0;
    if (bVar3) {
      pCVar1 = (Catalog *)(context->config).max_expression_depth;
      pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar7 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
               ::operator*(&bound_create_info);
      make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
                ((duckdb *)&new_storage,pCVar1,pSVar2,pBVar7,
                 (shared_ptr<duckdb::DataTable,_true> *)
                 &(context->config).user_variables._M_h._M_bucket_count);
      (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry =
           (_func_int **)
           new_storage.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    }
    else {
      physical_columns = ColumnList::LogicalToPhysical((ColumnList *)this_00,not_null_idx);
      make_uniq<duckdb::BoundNotNullConstraint,duckdb::PhysicalIndex&>
                ((duckdb *)&local_d8,&physical_columns);
      args_2 = shared_ptr<duckdb::DataTable,_true>::operator*
                         ((shared_ptr<duckdb::DataTable,_true> *)
                          &(context->config).user_variables._M_h._M_bucket_count);
      unique_ptr<duckdb::BoundNotNullConstraint,_std::default_delete<duckdb::BoundNotNullConstraint>,_true>
      ::operator*((unique_ptr<duckdb::BoundNotNullConstraint,_std::default_delete<duckdb::BoundNotNullConstraint>,_true>
                   *)&local_d8);
      make_shared_ptr<duckdb::DataTable,duckdb::ClientContext&,duckdb::DataTable&,duckdb::BoundNotNullConstraint&>
                ((ClientContext *)&new_storage,(DataTable *)info,(BoundNotNullConstraint *)args_2);
      pCVar1 = (Catalog *)(context->config).max_expression_depth;
      pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar7 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
               ::operator*(&bound_create_info);
      make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
                ((duckdb *)local_b0,pCVar1,pSVar2,pBVar7,&new_storage);
      (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry = (_func_int **)local_b0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_storage.internal.
                  super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(local_d8._M_pi)->_vptr__Sp_counted_base[1])();
      }
    }
    ::std::
    unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
    ~unique_ptr(&bound_create_info.
                 super_unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_100._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_100._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
    return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
  }
  this_03 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&binder,"Unsupported constraint for generated column!",
             (allocator *)&new_storage);
  BinderException::BinderException(this_03,(string *)&binder);
  __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::SetNotNull(ClientContext &context, SetNotNullInfo &info) {
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->comment = comment;
	create_info->tags = tags;
	create_info->columns = columns.Copy();

	auto not_null_idx = GetColumnIndex(info.column_name);
	if (columns.GetColumn(LogicalIndex(not_null_idx)).Generated()) {
		throw BinderException("Unsupported constraint for generated column!");
	}
	bool has_not_null = false;
	for (idx_t i = 0; i < constraints.size(); i++) {
		auto constraint = constraints[i]->Copy();
		if (constraint->type == ConstraintType::NOT_NULL) {
			auto &not_null = constraint->Cast<NotNullConstraint>();
			if (not_null.index == not_null_idx) {
				has_not_null = true;
			}
		}
		create_info->constraints.push_back(std::move(constraint));
	}
	if (!has_not_null) {
		create_info->constraints.push_back(make_uniq<NotNullConstraint>(not_null_idx));
	}
	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);

	// Early return
	if (has_not_null) {
		return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
	}

	// Return with new storage info. Note that we need the bound column index here.
	auto physical_columns = columns.LogicalToPhysical(LogicalIndex(not_null_idx));
	auto bound_constraint = make_uniq<BoundNotNullConstraint>(physical_columns);
	auto new_storage = make_shared_ptr<DataTable>(context, *storage, *bound_constraint);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}